

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::ObjectVariablesWalker::AddObjectProperties
          (ObjectVariablesWalker *this,int count,RecyclableObject *object)

{
  code *pcVar1;
  undefined4 *puVar2;
  bool bVar3;
  int iVar4;
  uint propertyId;
  undefined4 extraout_var;
  RecyclableObject *value;
  undefined4 extraout_var_00;
  VariableWalkerBase *pVVar5;
  uint uVar6;
  DebuggerPropertyDisplayInfo *local_68;
  DebuggerPropertyDisplayInfo *info;
  undefined4 *local_58;
  uint local_4c;
  ScriptContext *local_48;
  VariableWalkerBase *local_40;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isPropertyInDebuggerScope;
  bool isInDeadZone;
  bool isConst;
  
  iVar4 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
  local_48 = (ScriptContext *)CONCAT44(extraout_var,iVar4);
  local_40 = &this->super_VariableWalkerBase;
  info = (DebuggerPropertyDisplayInfo *)
         LocalsWalker::GetScopeWhenHaltAtFormals((this->super_VariableWalkerBase).pFrame);
  local_58 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  if (count < 1) {
    count = 0;
  }
  uVar6 = 0;
  local_4c = count;
  do {
    if (count == uVar6) {
      return;
    }
    propertyId = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(object,(ulong)(uVar6 & 0xffff));
    local_31[0] = false;
    local_33 = false;
    local_32 = false;
    if (((propertyId != 0xffffffff) &&
        (bVar3 = VariableWalkerBase::IsPropertyValid
                           (local_40,propertyId,0xffffffff,&local_33,local_31,&local_32), bVar3)) &&
       (iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x32])(object,(ulong)propertyId), iVar4 != 0)) {
      value = (RecyclableObject *)
              RecyclableObjectWalker::GetObject(object,object,propertyId,local_48);
      pVVar5 = local_40;
      if (value == (RecyclableObject *)0x0) {
        value = (((local_48->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      bVar3 = VariableWalkerBase::IsInParamScope((DebuggerScope *)info,local_40->pFrame);
      if ((bVar3) &&
         (iVar4 = (*pVVar5->pFrame->_vptr_DiagStackFrame[10])(),
         *(RecyclableObject **)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 8) + 0x4f8) == value)) {
        value = (((local_48->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      if (((((object->type).ptr)->typeId & ~TypeIds_Null) == TypeIds_GlobalObject) &&
         ((local_31[0] & 1U) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar2 = local_58;
        *local_58 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x360,"(!VarIs<RootObjectBase>(object) || !isConst)",
                                    "root object shouldn\'t produce const properties through IsPropertyValid"
                                   );
        if (!bVar3) goto LAB_007e802c;
        *puVar2 = 0;
      }
      pVVar5 = local_40;
      local_68 = VariableWalkerBase::AllocateNewPropertyDisplayInfo
                           (local_40,propertyId,value,(bool)(local_31[0] & 1),local_32);
      count = local_4c;
      if (local_68 == (DebuggerPropertyDisplayInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar2 = local_58;
        *local_58 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x368,"(info)","info");
        if (!bVar3) {
LAB_007e802c:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar2 = 0;
        pVVar5 = local_40;
      }
      JsUtil::
      List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(pVVar5->pMembersList,&local_68);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void ObjectVariablesWalker::AddObjectProperties(int count, Js::RecyclableObject* object)
    {
        ScriptContext * scriptContext = pFrame->GetScriptContext();

        DebuggerScope *formalScope = LocalsWalker::GetScopeWhenHaltAtFormals(pFrame);

        // For the scopes and locals only enumerable properties will be shown.
        for (int i = 0; i < count; i++)
        {
            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);

            bool isConst = false;
            bool isPropertyInDebuggerScope = false;
            bool isInDeadZone = false;
            if (propertyId != Js::Constants::NoProperty
                && IsPropertyValid(propertyId, Js::Constants::NoRegister, &isPropertyInDebuggerScope, &isConst, &isInDeadZone)
                && object->IsEnumerable(propertyId))
            {
                Var itemObj = RecyclableObjectWalker::GetObject(object, object, propertyId, scriptContext);
                if (itemObj == nullptr)
                {
                    itemObj = scriptContext->GetLibrary()->GetUndefined();
                }

                if (IsInParamScope(formalScope, pFrame) && pFrame->GetScriptContext()->IsUndeclBlockVar(itemObj))
                {
                    itemObj = scriptContext->GetLibrary()->GetUndefined();
                }

                AssertMsg(!VarIs<RootObjectBase>(object) || !isConst, "root object shouldn't produce const properties through IsPropertyValid");

                DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(
                    propertyId,
                    itemObj,
                    isConst,
                    isInDeadZone);

                Assert(info);
                pMembersList->Add(info);
            }
        }
    }